

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  
  if ((flags & 4U) != 0) {
    return GImGui->NavWindow != (ImGuiWindow *)0x0;
  }
  pIVar1 = GImGui->NavWindow;
  switch(flags & 3) {
  case 0:
    bVar2 = pIVar1 == GImGui->CurrentWindow;
    break;
  case 1:
    if (pIVar1 == (ImGuiWindow *)0x0) {
      return false;
    }
    if (pIVar1->RootWindow != GImGui->CurrentWindow) {
      do {
        bVar2 = pIVar1 == GImGui->CurrentWindow;
        if (bVar2) {
          return bVar2;
        }
        pIVar1 = pIVar1->ParentWindow;
      } while (pIVar1 != (ImGuiWindow *)0x0);
      return bVar2;
    }
    return true;
  case 3:
    if (pIVar1 == (ImGuiWindow *)0x0) {
      return false;
    }
    pIVar1 = pIVar1->RootWindowDockStop;
  case 2:
    bVar2 = pIVar1 == GImGui->CurrentWindow->RootWindowDockStop;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()
    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindowDockStop == g.CurrentWindow->RootWindowDockStop;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindowDockStop;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}